

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_help.c
# Opt level: O0

void print_category(uint category,uint cols)

{
  size_t sVar1;
  size_t desclen;
  size_t opt;
  size_t len;
  size_t longdesc;
  size_t longopt;
  uint i;
  uint cols_local;
  uint category_local;
  
  longdesc = 5;
  len = 5;
  longopt._4_4_ = 0;
  while (helptext[longopt._4_4_].opt != (char *)0x0) {
    if ((helptext[longopt._4_4_].categories & category) != 0) {
      sVar1 = strlen(helptext[longopt._4_4_].opt);
      if (longdesc < sVar1) {
        longdesc = sVar1;
      }
      sVar1 = strlen(helptext[longopt._4_4_].desc);
      if (len < sVar1) {
        len = sVar1;
      }
    }
    longopt._4_4_ = longopt._4_4_ + 1;
  }
  if ((ulong)cols < longdesc + len) {
    longdesc = cols - len;
  }
  longopt._4_4_ = 0;
  while (helptext[longopt._4_4_].opt != (char *)0x0) {
    if ((helptext[longopt._4_4_].categories & category) != 0) {
      desclen = longdesc;
      sVar1 = strlen(helptext[longopt._4_4_].desc);
      if ((ulong)(cols - 2) <= longdesc + sVar1) {
        if (sVar1 < cols - 2) {
          desclen = (cols - 3) - sVar1;
        }
        else {
          desclen = 0;
        }
      }
      curl_mprintf(" %-*s  %s\n",desclen & 0xffffffff,helptext[longopt._4_4_].opt,
                   helptext[longopt._4_4_].desc);
    }
    longopt._4_4_ = longopt._4_4_ + 1;
  }
  return;
}

Assistant:

static void print_category(unsigned int category, unsigned int cols)
{
  unsigned int i;
  size_t longopt = 5;
  size_t longdesc = 5;

  for(i = 0; helptext[i].opt; ++i) {
    size_t len;
    if(!(helptext[i].categories & category))
      continue;
    len = strlen(helptext[i].opt);
    if(len > longopt)
      longopt = len;
    len = strlen(helptext[i].desc);
    if(len > longdesc)
      longdesc = len;
  }
  if(longopt + longdesc > cols)
    longopt = cols - longdesc;

  for(i = 0; helptext[i].opt; ++i)
    if(helptext[i].categories & category) {
      size_t opt = longopt;
      size_t desclen = strlen(helptext[i].desc);
      if(opt + desclen >= (cols - 2)) {
        if(desclen < (cols - 2))
          opt = (cols - 3) - desclen;
        else
          opt = 0;
      }
      printf(" %-*s  %s\n", (int)opt, helptext[i].opt, helptext[i].desc);
    }
}